

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field,bool immutable,
          ClassNameResolver *name_resolver)

{
  float value;
  double value_00;
  string *text;
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  EnumValueDescriptor *pEVar4;
  LogMessage *pLVar5;
  undefined7 in_register_00000009;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  java *this_00;
  char *pcVar6;
  allocator local_251;
  LogMessage local_250;
  undefined1 local_218 [48];
  string local_1e8;
  undefined1 local_1c8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [2];
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  SubstituteArg local_e8;
  SubstituteArg local_b8;
  SubstituteArg local_88;
  SubstituteArg local_58;
  
  this_00 = this;
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_250,*(int *)(this + 0x40));
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_250,a);
    return __return_storage_ptr__;
  case CPPTYPE_INT64:
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_250,*(long *)(this + 0x40));
    StrCat_abi_cxx11_((string *)local_218,(protobuf *)&local_250,a_00);
    std::operator+(__return_storage_ptr__,(string *)local_218,"L");
    break;
  case CPPTYPE_UINT64:
    strings::AlphaNum::AlphaNum((AlphaNum *)&local_250,*(long *)(this + 0x40));
    StrCat_abi_cxx11_((string *)local_218,(protobuf *)&local_250,a_01);
    std::operator+(__return_storage_ptr__,(string *)local_218,"L");
    break;
  case CPPTYPE_DOUBLE:
    value_00 = *(double *)(this + 0x40);
    if (INFINITY <= value_00) {
      pcVar6 = "Double.POSITIVE_INFINITY";
      goto LAB_0029538f;
    }
    if (value_00 <= -INFINITY) {
      pcVar6 = "Double.NEGATIVE_INFINITY";
      goto LAB_0029538f;
    }
    if (NAN(value_00)) {
      pcVar6 = "Double.NaN";
      goto LAB_0029538f;
    }
    SimpleDtoa_abi_cxx11_((string *)&local_250,(protobuf *)this_00,value_00);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250,
                   "D");
    goto LAB_0029508c;
  case CPPTYPE_FLOAT:
    value = *(float *)(this + 0x40);
    if (INFINITY <= value) {
      pcVar6 = "Float.POSITIVE_INFINITY";
      goto LAB_0029538f;
    }
    if (value <= -INFINITY) {
      pcVar6 = "Float.NEGATIVE_INFINITY";
      goto LAB_0029538f;
    }
    if (NAN(value)) {
      pcVar6 = "Float.NaN";
      goto LAB_0029538f;
    }
    SimpleFtoa_abi_cxx11_((string *)&local_250,(protobuf *)this_00,value);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250,
                   "F");
    goto LAB_0029508c;
  case CPPTYPE_BOOL:
    pcVar6 = "false";
    if (this[0x40] != (java)0x0) {
      pcVar6 = "true";
    }
    goto LAB_0029538f;
  case CPPTYPE_ENUM:
    descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_218,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),
               descriptor_00,SUB81(field,0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250,
                   (string *)local_218,".");
    pEVar4 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (pEVar4 + 8));
LAB_0029533d:
    std::__cxx11::string::~string((string *)&local_250);
    break;
  case CPPTYPE_STRING:
    TVar3 = FieldDescriptor::type((FieldDescriptor *)this);
    if (TVar3 == TYPE_BYTES) {
      if (((byte)this[1] & 1) == 0) {
        pcVar6 = "com.google.protobuf.ByteString.EMPTY";
        goto LAB_0029538f;
      }
      std::__cxx11::string::string
                ((string *)local_1c8,"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
                 &local_251);
      CEscape((string *)(local_218 + 0x30),*(string **)(this + 0x40));
      local_218._0_8_ = (pointer)0x0;
      local_218._8_4_ = -1;
      local_58.text_ = (char *)0x0;
      local_58.size_ = -1;
      local_88.text_ = (char *)0x0;
      local_88.size_ = -1;
      local_b8.text_ = (char *)0x0;
      local_b8.size_ = -1;
      local_e8.text_ = (char *)0x0;
      local_e8.size_ = -1;
      local_118.text_ = (char *)0x0;
      local_118.size_ = -1;
      local_148.text_ = (char *)0x0;
      local_250._0_8_ = local_1e8._M_dataplus._M_p;
      local_148.size_ = -1;
      local_178.text_ = (char *)0x0;
      local_178.size_ = -1;
      local_1c8._32_8_ = 0;
      local_250.filename_._0_4_ = (undefined4)local_1e8._M_string_length;
      local_1a0[0]._M_allocated_capacity._0_4_ = 0xffffffff;
      strings::Substitute(__return_storage_ptr__,(string *)local_1c8,(SubstituteArg *)&local_250,
                          (SubstituteArg *)local_218,&local_58,&local_88,&local_b8,&local_e8,
                          &local_118,&local_148,&local_178,(SubstituteArg *)(local_1c8 + 0x20));
    }
    else {
      text = *(string **)(this + 0x40);
      bVar1 = AllAscii(text);
      if (bVar1) {
        CEscape((string *)local_218,text);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_250,"\"",(string *)local_218);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_250,"\"");
        goto LAB_0029533d;
      }
      std::__cxx11::string::string
                ((string *)local_1c8,"com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
                 &local_251);
      CEscape((string *)(local_218 + 0x30),*(string **)(this + 0x40));
      local_218._0_8_ = (pointer)0x0;
      local_218._8_4_ = -1;
      local_58.text_ = (char *)0x0;
      local_58.size_ = -1;
      local_88.text_ = (char *)0x0;
      local_88.size_ = -1;
      local_b8.text_ = (char *)0x0;
      local_b8.size_ = -1;
      local_e8.text_ = (char *)0x0;
      local_e8.size_ = -1;
      local_118.text_ = (char *)0x0;
      local_118.size_ = -1;
      local_148.text_ = (char *)0x0;
      local_250._0_8_ = local_1e8._M_dataplus._M_p;
      local_148.size_ = -1;
      local_178.text_ = (char *)0x0;
      local_178.size_ = -1;
      local_1c8._32_8_ = 0;
      local_250.filename_._0_4_ = (undefined4)local_1e8._M_string_length;
      local_1a0[0]._M_allocated_capacity._0_4_ = 0xffffffff;
      strings::Substitute(__return_storage_ptr__,(string *)local_1c8,(SubstituteArg *)&local_250,
                          (SubstituteArg *)local_218,&local_58,&local_88,&local_b8,&local_e8,
                          &local_118,&local_148,&local_178,(SubstituteArg *)(local_1c8 + 0x20));
    }
    std::__cxx11::string::~string((string *)(local_218 + 0x30));
    pLVar5 = (LogMessage *)local_1c8;
    goto LAB_0029534c;
  case CPPTYPE_MESSAGE:
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_250,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),
               descriptor,SUB81(field,0));
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250,
                   ".getDefaultInstance()");
LAB_0029508c:
    pLVar5 = &local_250;
    goto LAB_0029534c;
  default:
    internal::LogMessage::LogMessage
              (&local_250,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x285);
    pLVar5 = internal::LogMessage::operator<<(&local_250,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)local_218,pLVar5);
    internal::LogMessage::~LogMessage(&local_250);
    pcVar6 = "";
LAB_0029538f:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar6,(allocator *)&local_250);
    return __return_storage_ptr__;
  }
  pLVar5 = (LogMessage *)local_218;
LAB_0029534c:
  std::__cxx11::string::~string((string *)pLVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field, bool immutable,
                         ClassNameResolver* name_resolver) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return StrCat(static_cast<int32_t>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return StrCat(field->default_value_int64()) + "L";
    case FieldDescriptor::CPPTYPE_UINT64:
      return StrCat(static_cast<int64_t>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return SimpleDtoa(value) + "D";
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return SimpleFtoa(value) + "F";
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
              "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
              CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return "\"" + CEscape(field->default_value_string()) + "\"";
        } else {
          // See comments in Internal.java for gory details.
          return strings::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return name_resolver->GetClassName(field->enum_type(), immutable) + "." +
             field->default_value_enum()->name();

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return name_resolver->GetClassName(field->message_type(), immutable) +
             ".getDefaultInstance()";

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}